

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O1

TAttributeType __thiscall
glslang::TParseContext::attributeFromName(TParseContext *this,TString *name)

{
  int iVar1;
  TAttributeType TVar2;
  
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(name,"branch");
  TVar2 = EatBranch;
  if ((iVar1 != 0) &&
     (iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"dont_flatten"), iVar1 != 0)) {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(name,"flatten");
    if (iVar1 == 0) {
      TVar2 = EatFlatten;
    }
    else {
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"unroll");
      if (iVar1 == 0) {
        TVar2 = EatUnroll;
      }
      else {
        iVar1 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (name,"loop");
        TVar2 = EatLoop;
        if ((iVar1 != 0) &&
           (iVar1 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(name,"dont_unroll"), iVar1 != 0)) {
          iVar1 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(name,"dependency_infinite");
          if (iVar1 == 0) {
            TVar2 = EatDependencyInfinite;
          }
          else {
            iVar1 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(name,"dependency_length");
            if (iVar1 == 0) {
              TVar2 = EatDependencyLength;
            }
            else {
              iVar1 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(name,"min_iterations");
              if (iVar1 == 0) {
                TVar2 = EatMinIterations;
              }
              else {
                iVar1 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare(name,"max_iterations");
                if (iVar1 == 0) {
                  TVar2 = EatMaxIterations;
                }
                else {
                  iVar1 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::compare(name,"iteration_multiple");
                  if (iVar1 == 0) {
                    TVar2 = EatIterationMultiple;
                  }
                  else {
                    iVar1 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::compare(name,"peel_count");
                    if (iVar1 == 0) {
                      TVar2 = EatPeelCount;
                    }
                    else {
                      iVar1 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::compare(name,"partial_count");
                      if (iVar1 == 0) {
                        TVar2 = EatPartialCount;
                      }
                      else {
                        iVar1 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::compare(name,"subgroup_uniform_control_flow");
                        if (iVar1 == 0) {
                          TVar2 = EatSubgroupUniformControlFlow;
                        }
                        else {
                          iVar1 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  ::compare(name,"export");
                          if (iVar1 == 0) {
                            TVar2 = EatExport;
                          }
                          else {
                            iVar1 = std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    ::compare(name,"maximally_reconverges");
                            TVar2 = EatMaximallyReconverges;
                            if (iVar1 != 0) {
                              TVar2 = EatNone;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

TAttributeType TParseContext::attributeFromName(const TString& name) const
{
    if (name == "branch" || name == "dont_flatten")
        return EatBranch;
    else if (name == "flatten")
        return EatFlatten;
    else if (name == "unroll")
        return EatUnroll;
    else if (name == "loop" || name == "dont_unroll")
        return EatLoop;
    else if (name == "dependency_infinite")
        return EatDependencyInfinite;
    else if (name == "dependency_length")
        return EatDependencyLength;
    else if (name == "min_iterations")
        return EatMinIterations;
    else if (name == "max_iterations")
        return EatMaxIterations;
    else if (name == "iteration_multiple")
        return EatIterationMultiple;
    else if (name == "peel_count")
        return EatPeelCount;
    else if (name == "partial_count")
        return EatPartialCount;
    else if (name == "subgroup_uniform_control_flow")
        return EatSubgroupUniformControlFlow;
    else if (name == "export")
        return EatExport;
    else if (name == "maximally_reconverges")
        return EatMaximallyReconverges;
    else
        return EatNone;
}